

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

int __thiscall P_Quantifier::match(P_Quantifier *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  pointer *ppiVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pSVar6;
  bool bVar7;
  StateP sp;
  value_type local_90;
  
  pSVar6 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Grid::Grid((Grid *)&local_90,(Grid *)(pSVar6 + -1));
  local_90.st.flags = pSVar6[-1].st.flags;
  local_90.st.direction = pSVar6[-1].st.direction;
  local_90.st.position = pSVar6[-1].st.position;
  std::vector<int,_std::allocator<int>_>::vector(&local_90.st.qcount,&pSVar6[-1].st.qcount);
  local_90.iseq = pSVar6[-1].iseq;
  local_90.seq = pSVar6[-1].seq;
  std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  uVar3 = local_90.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  uVar4 = this->minimum;
  uVar5 = this->maximum;
  bVar7 = uVar4 <= uVar3;
  if (this->reluctant != false) {
    bVar7 = uVar3 < uVar5;
  }
  if (bVar7) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back(stk,&local_90);
    pSVar6 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar1 = &pSVar6[-1].iseq;
    *piVar1 = *piVar1 + this->offset;
    ppiVar2 = &pSVar6[-1].st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar2 = *ppiVar2 + -1;
  }
  bVar7 = uVar3 < uVar5;
  if (this->reluctant != false) {
    bVar7 = uVar4 <= uVar3;
  }
  if (bVar7) {
    std::vector<StateP,_std::allocator<StateP>_>::push_back(stk,&local_90);
    pSVar6 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    piVar1 = &pSVar6[-1].iseq;
    *piVar1 = *piVar1 + 1;
    piVar1 = pSVar6[-1].st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    *piVar1 = *piVar1 + 1;
  }
  if (local_90.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.st.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)&local_90);
  return 0;
}

Assistant:

int P_Quantifier::match(vector<StateP> &stk) {
    StateP sp = stk.back(); stk.pop_back();
    unsigned count = sp.st.qcount.back();
    bool again = count < maximum, stop = count >= minimum;
    if (reluctant ? again : stop) {
        stk.push_back(sp);
        stk.back().iseq += offset;
        stk.back().st.qcount.pop_back();
    } 
    if (reluctant ? stop : again) {
        stk.push_back(sp);
        stk.back().iseq++;
        stk.back().st.qcount.back()++;
    }
    return 0;
}